

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# download.cc
# Opt level: O3

int send_request(http_t *info)

{
  char *__s;
  int __fd;
  size_t __n;
  ssize_t sVar1;
  
  __s = info->buffer;
  memset(__s,0,0x2000);
  snprintf(__s,0x1fff,
           "GET %s HTTP/1.1\r\nAccept: */*\r\nUser-Agent: Mozilla/5.0 (compatible; MSIE 5.01; Windows NT 5.0)\r\nHost: %s\r\nConnection: Close\r\n\r\n"
           ,info->url,info->host_name);
  __fd = info->sock;
  __n = strlen(__s);
  sVar1 = send(__fd,__s,__n,0);
  return (int)sVar1;
}

Assistant:

int send_request(http_t *info) {
  int len;

  memset(info->buffer, 0x0, RECV_BUF);
  snprintf(info->buffer, RECV_BUF - 1,
           "GET %s HTTP/1.1\r\n"
           "Accept: */*\r\n"
           "User-Agent: Mozilla/5.0 (compatible; MSIE 5.01; Windows NT 5.0)\r\n"
           "Host: %s\r\n"
           "Connection: Close\r\n\r\n",
           info->url, info->host_name);

  lprintf(MSG_DEBUG, "request:\n%s\n", info->buffer);
  return send(info->sock, info->buffer, strlen(info->buffer), 0);
}